

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

char * __thiscall
Memory::Recycler::TryLargeAlloc
          (Recycler *this,HeapInfo *heap,size_t size,ObjectInfoBits attributes,bool nothrow)

{
  code *pcVar1;
  bool bVar2;
  size_t size_00;
  LargeHeapBlock *this_00;
  undefined8 *in_FS_OFFSET;
  LargeHeapBlock *heapBlock;
  char *memBlock;
  size_t sizeCat;
  bool nothrow_local;
  ObjectInfoBits attributes_local;
  size_t size_local;
  HeapInfo *heap_local;
  Recycler *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x508,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x509,"(size != 0)","size != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  size_00 = HeapInfo::GetAlignedSizeNoCheck(size);
  if (size_00 == 0) {
    if (!nothrow) {
      OutOfMemory(this);
    }
    this_local = (Recycler *)0x0;
  }
  else if (((heap->largeObjectBucket).largeBlockList == (LargeHeapBlock *)0x0) ||
          (this_local = (Recycler *)
                        LargeHeapBlock::Alloc
                                  ((heap->largeObjectBucket).largeBlockList,size_00,attributes),
          this_local == (Recycler *)0x0)) {
    if ((this->disableCollectOnAllocationHeuristics & 1U) == 0) {
      CollectNow<(Memory::CollectionFlags)404819971>(this);
    }
    bVar2 = IsPageHeapEnabled(this);
    if (((bVar2) &&
        (bVar2 = HeapBucket::IsPageHeapEnabled
                           (&(heap->largeObjectBucket).super_HeapBucket,attributes), bVar2)) &&
       (this_local = (Recycler *)
                     LargeHeapBucket::PageHeapAlloc
                               (&heap->largeObjectBucket,this,size_00,size,attributes,
                                heap->pageHeapMode,nothrow), this_local != (Recycler *)0x0)) {
      VerifyLargeAllocZeroFill(this,this_local,size,attributes);
    }
    else {
      this_00 = HeapInfo::AddLargeHeapBlock(heap,size_00);
      if (this_00 == (LargeHeapBlock *)0x0) {
        this_local = (Recycler *)0x0;
      }
      else {
        this_local = (Recycler *)LargeHeapBlock::Alloc(this_00,size_00,attributes);
        if (this_local == (Recycler *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x544,"(memBlock != nullptr)","memBlock != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        VerifyLargeAllocZeroFill(this,this_local,size_00,attributes);
      }
    }
  }
  else {
    VerifyLargeAllocZeroFill(this,this_local,size_00,attributes);
  }
  return (char *)this_local;
}

Assistant:

char *
Recycler::TryLargeAlloc(HeapInfo * heap, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
    Assert(size != 0);

    size_t sizeCat = HeapInfo::GetAlignedSizeNoCheck(size);
    if (sizeCat == 0)
    {
        // overflow scenario
        // if onthrow is false, throw out of memory
        // otherwise, return null
        if (nothrow == false)
        {
            this->OutOfMemory();
        }
        return nullptr;
    }

    char * memBlock;
    if (heap->largeObjectBucket.largeBlockList != nullptr)
    {
        memBlock = heap->largeObjectBucket.largeBlockList->Alloc(sizeCat, attributes);
        if (memBlock != nullptr)
        {
#ifdef RECYCLER_ZERO_MEM_CHECK
            VerifyLargeAllocZeroFill(memBlock, sizeCat, attributes);
#endif
            return memBlock;
        }
    }

    // We don't care whether a GC happened here or not, because we are not reusing freed
    // large objects. We might try to allocate from existing block if we implement
    // large object reuse.
    if (!this->disableCollectOnAllocationHeuristics)
    {
        CollectNow<CollectOnAllocation>();
    }

#ifdef RECYCLER_PAGE_HEAP
    if (IsPageHeapEnabled())
    {
        if (heap->largeObjectBucket.IsPageHeapEnabled(attributes))
        {
            memBlock = heap->largeObjectBucket.PageHeapAlloc(this, sizeCat, size, (ObjectInfoBits)attributes, heap->pageHeapMode, nothrow);
            if (memBlock != nullptr)
            {
#ifdef RECYCLER_ZERO_MEM_CHECK
                VerifyLargeAllocZeroFill(memBlock, size, attributes);
#endif
                return memBlock;
            }
        }
    }
#endif

    LargeHeapBlock * heapBlock = heap->AddLargeHeapBlock(sizeCat);
    if (heapBlock == nullptr)
    {
        return nullptr;
    }
    memBlock = heapBlock->Alloc(sizeCat, attributes);
    Assert(memBlock != nullptr);
#ifdef RECYCLER_ZERO_MEM_CHECK
    VerifyLargeAllocZeroFill(memBlock, sizeCat, attributes);
#endif
    return memBlock;
}